

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedModuleElements.cpp
# Opt level: O2

void __thiscall wasm::Analyzer::addReferences(Analyzer *this,Expression *curr)

{
  Name name;
  Global *pGVar1;
  Module *pMVar2;
  pointer pNVar3;
  undefined1 auStack_1a8 [8];
  ReferenceFinder finder;
  Name func;
  Expression *local_50;
  Expression *curr_local;
  pair<wasm::ModuleElementKind,_wasm::Name> element;
  
  auStack_1a8 = (undefined1  [8])0x0;
  finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
  super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.replacep =
       (Expression **)0x0;
  local_50 = curr;
  memset((Expression ***)
         ((long)(finder.
                 super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                 .super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
                 stack.fixed._M_elems + 9) + 8),0,0x88);
  finder.super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
  super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.currFunction =
       (Function *)this->module;
  Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>::walk
            ((Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_> *)
             auStack_1a8,&local_50);
  for (pMVar2 = finder.
                super_PostWalker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>
                .super_Walker<wasm::ReferenceFinder,_wasm::Visitor<wasm::ReferenceFinder,_void>_>.
                currModule;
      pMVar2 != (Module *)
                finder.elements.
                super__Vector_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar2 = (Module *)&pMVar2->functions) {
    element.second.super_IString.str._M_len =
         (size_t)(pMVar2->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    curr_local = (Expression *)
                 (pMVar2->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
    element._0_8_ =
         (pMVar2->exports).
         super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::__detail::
    _Insert_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::insert((_Insert_base<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              *)&this->referenced,(value_type *)&curr_local);
    if ((int)curr_local == 1) {
      name.super_IString.str._M_str = (char *)element.second.super_IString.str._M_len;
      name.super_IString.str._M_len = element._0_8_;
      pGVar1 = Module::getGlobal(this->module,name);
      if ((pGVar1->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
        addReferences(this,pGVar1->init);
      }
    }
  }
  for (pNVar3 = (pointer)finder.callRefTypes.
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage;
      pNVar3 != finder.refFuncs.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                super__Vector_impl_data._M_start; pNVar3 = pNVar3 + 1) {
    element._0_8_ = (pNVar3->super_IString).str._M_len;
    element.second.super_IString.str._M_len = (size_t)(pNVar3->super_IString).str._M_str;
    curr_local = (Expression *)((ulong)curr_local & 0xffffffff00000000);
    std::__detail::
    _Insert<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
    ::insert((_Insert<std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::pair<wasm::ModuleElementKind,_wasm::Name>,_std::allocator<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Identity,_std::equal_to<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::hash<std::pair<wasm::ModuleElementKind,_wasm::Name>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>,_true>
              *)&this->referenced,(value_type *)&curr_local);
  }
  ReferenceFinder::~ReferenceFinder((ReferenceFinder *)auStack_1a8);
  return;
}

Assistant:

void addReferences(Expression* curr) {
    // Find references anywhere in this expression so we can apply them.
    ReferenceFinder finder;
    finder.setModule(module);
    finder.walk(curr);

    for (auto element : finder.elements) {
      referenced.insert(element);

      auto& [kind, value] = element;
      if (kind == ModuleElementKind::Global) {
        // Like functions, (non-imported) globals have contents. For functions,
        // things are simple: if a function ends up with references but no uses
        // then we can simply empty out the function (by setting its body to an
        // unreachable). We don't have a simple way to do the same for globals,
        // unfortunately. For now, scan the global's contents and add references
        // as needed.
        // TODO: We could try to empty the global out, for example, replace it
        //       with a null if it is nullable, or replace all gets of it with
        //       something else, but that is not trivial.
        auto* global = module->getGlobal(value);
        if (!global->imported()) {
          // Note that infinite recursion is not a danger here since a global
          // can only refer to previous globals.
          addReferences(global->init);
        }
      }
    }

    for (auto func : finder.refFuncs) {
      // If a function ends up referenced but not used then later down we will
      // empty it out by replacing its body with an unreachable, which always
      // validates. For that reason all we need to do here is mark the function
      // as referenced - we don't need to do anything with the body.
      //
      // Note that it is crucial that we do not call useRefFunc() here: we are
      // just adding a reference to the function, and not actually using the
      // RefFunc. (Only useRefFunc() + a CallRef of the proper type are enough
      // to make a function itself used.)
      referenced.insert({ModuleElementKind::Function, func});
    }

    // Note: nothing to do with |callRefTypes| and |structFields|, which only
    // involve types. This function only cares about references to module
    // elements like functions, globals, and tables. (References to types are
    // handled in an entirely different way in Binaryen IR, and we don't need to
    // worry about it.)
  }